

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_manyvector.c
# Opt level: O0

sunrealtype N_VWrmsNormMask_ManyVector(N_Vector x,N_Vector w,N_Vector id)

{
  N_Vector in_RSI;
  N_Vector in_RDI;
  sunrealtype sVar1;
  N_Vector unaff_retaddr;
  sunrealtype gsum;
  SUNContext_conflict sunctx_local_scope_;
  double local_30;
  
  sVar1 = N_VWSqrSumMaskLocal_ManyVector(unaff_retaddr,in_RDI,in_RSI);
  if (0.0 < sVar1 / (double)*(long *)((long)in_RDI->content + 8)) {
    local_30 = sqrt(sVar1 / (double)*(long *)((long)in_RDI->content + 8));
  }
  else {
    local_30 = 0.0;
  }
  return local_30;
}

Assistant:

sunrealtype MVAPPEND(N_VWrmsNormMask)(N_Vector x, N_Vector w, N_Vector id)
{
  SUNFunctionBegin(x->sunctx);
  sunrealtype gsum;
#ifdef MANYVECTOR_BUILD_WITH_MPI
  sunrealtype lsum;
  lsum = gsum = N_VWSqrSumMaskLocal_MPIManyVector(x, w, id);
  SUNCheckLastErrNoRet();
  if (MANYVECTOR_COMM(x) != MPI_COMM_NULL)
  {
    SUNCheckMPICallNoRet(MPI_Allreduce(&lsum, &gsum, 1, MPI_SUNREALTYPE,
                                       MPI_SUM, MANYVECTOR_COMM(x)));
  }
#else
  gsum = N_VWSqrSumMaskLocal_ManyVector(x, w, id);
  SUNCheckLastErrNoRet();
#endif
  return (SUNRsqrt(gsum / (MANYVECTOR_GLOBLENGTH(x))));
}